

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O2

int __thiscall
table::select_abi_cxx11_
          (table *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  undefined8 *puVar1;
  pointer ppcVar2;
  column *pcVar3;
  ostream *poVar4;
  pointer ppcVar5;
  undefined8 *puVar6;
  undefined4 in_register_00000034;
  table *this_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  cols;
  string colName;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  local_98;
  string *local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>
  local_78;
  string local_50;
  
  this_00 = (table *)CONCAT44(in_register_00000034,__nfds);
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar6 = *(undefined8 **)__readfds->fds_bits[4];
  puVar1 = (undefined8 *)((undefined8 *)__readfds->fds_bits[4])[1];
  if (((long)puVar1 - (long)puVar6 == 8) && (*(int *)*puVar6 == 3)) {
    ppcVar2 = (this_00->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar5 = (this_00->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar2;
        ppcVar5 = ppcVar5 + 1) {
      pcVar3 = *ppcVar5;
      std::__cxx11::string::string((string *)&local_78,(string *)&pcVar3->name);
      local_78.second = pcVar3;
      std::
      vector<std::pair<std::__cxx11::string,column*>,std::allocator<std::pair<std::__cxx11::string,column*>>>
      ::emplace_back<std::pair<std::__cxx11::string,column*>>
                ((vector<std::pair<std::__cxx11::string,column*>,std::allocator<std::pair<std::__cxx11::string,column*>>>
                  *)&local_98,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  else {
    local_80 = (string *)&this_00->absname;
    for (; puVar6 != puVar1; puVar6 = puVar6 + 1) {
      if ((*(uint *)*puVar6 | 4) == 5) {
        std::__cxx11::string::string
                  ((string *)&local_50,*(char **)((uint *)*puVar6 + 10),(allocator *)&local_78);
        pcVar3 = getColumn(this_00,&local_50);
        if (pcVar3 == (column *)0x0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Column \'");
          poVar4 = std::operator<<(poVar4,(string *)&local_50);
          poVar4 = std::operator<<(poVar4,"\' does not exist in table ");
          std::__cxx11::string::string((string *)&local_78,local_80);
          poVar4 = std::operator<<(poVar4,(string *)&local_78);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::__cxx11::string::~string((string *)&local_78);
          this->_vptr_table = (_func_int **)0x0;
          (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
        }
        else {
          std::__cxx11::string::string((string *)&local_78,(string *)&pcVar3->name);
          local_78.second = pcVar3;
          std::
          vector<std::pair<std::__cxx11::string,column*>,std::allocator<std::pair<std::__cxx11::string,column*>>>
          ::emplace_back<std::pair<std::__cxx11::string,column*>>
                    ((vector<std::pair<std::__cxx11::string,column*>,std::allocator<std::pair<std::__cxx11::string,column*>>>
                      *)&local_98,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        }
        std::__cxx11::string::~string((string *)&local_50);
        if (pcVar3 == (column *)0x0) goto LAB_001152d3;
      }
    }
  }
  this->_vptr_table =
       (_func_int **)
       local_98.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_98.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_98.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_001152d3:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_column_*>_>_>
  ::~vector(&local_98);
  return (int)this;
}

Assistant:

vector<pair<string, column*>> table::select(hsql::SelectStatement *stmt){

    vector<pair<string, column*>> cols;

    if(stmt->selectList->size() == 1 && (*stmt->selectList)[0]->type == hsql::kExprStar) {    // select *
        for (auto col : table_cols)
            cols.push_back(make_pair(col->name, col));
    }
    else{
        for(hsql::Expr* expr : *stmt->selectList){

            if(expr->type == hsql::kExprLiteralString || expr->type == hsql::kExprColumnRef){   // select C1,C2,...
                string colName = expr->name;
                column *col = getColumn(colName);
                if(col == NULL){
                    cout <<"Column '"<<colName<<"' does not exist in table "<<getabsName()<<endl;
                    return {};
                }else{
                    cols.push_back(make_pair(col->name, col));
                }
            }//else if(expr->type == hsql::kExprLiteralInt){
            //    cols.push_back(make_pair(to_string(expr->ival), (column*)NULL));
            //}
        }
    }
    return cols;

}